

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType id;
  Type TVar1;
  HeapType local_30;
  Type local_28;
  RefNull *local_20;
  RefNull *ret;
  Builder *this_local;
  HeapType type_local;
  
  ret = (RefNull *)this;
  this_local = (Builder *)type.id;
  TVar1.id = (uintptr_t)MixedArena::alloc<wasm::RefNull>(&this->wasm->allocator);
  local_20 = (RefNull *)TVar1.id;
  id = HeapType::getBottom((HeapType *)&this_local);
  HeapType::HeapType(&local_30,id);
  Type::Type(&local_28,local_30,Nullable,Inexact);
  wasm::RefNull::finalize(TVar1);
  return local_20;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }